

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndColumns(void)

{
  int *piVar1;
  undefined8 *puVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  undefined8 uVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  uint uVar9;
  ImU32 col;
  ImGuiColumnData *__dest;
  ImGuiContext *pIVar10;
  ImGuiID id;
  ImGuiColumnData *pIVar11;
  int column_index;
  ImGuiContext *g;
  uint uVar12;
  float fVar13;
  float fVar14;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  bool held;
  bool hovered;
  ImGuiID column_id;
  ImRect column_rect;
  bool local_aa;
  bool local_a9;
  undefined1 local_a8 [16];
  ulong local_90;
  float local_84;
  float local_80;
  ImGuiID local_7c;
  ImVec4 local_78;
  ImVec2 local_60;
  ImRect local_58;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar10 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->Accessed = true;
  if ((pIVar4->DC).ColumnsCount < 2) {
    __assert_fail("window->DC.ColumnsCount > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                  ,0x27e3,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  PopClipRect();
  ImDrawList::ChannelsMerge(pIVar4->DrawList);
  fVar13 = (pIVar4->DC).ColumnsCellMaxY;
  fVar14 = (pIVar4->DC).CursorPos.y;
  fVar3 = (pIVar4->DC).ColumnsMaxX;
  uVar12 = -(uint)(fVar14 <= fVar13);
  local_48 = (float)(~uVar12 & (uint)fVar14 | (uint)fVar13 & uVar12);
  (pIVar4->DC).ColumnsCellMaxY = local_48;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  (pIVar4->DC).CursorPos.y = local_48;
  fVar13 = (pIVar4->DC).ColumnsStartMaxPosX;
  uVar12 = -(uint)(fVar3 <= fVar13);
  (pIVar4->DC).CursorMaxPos.x = (float)(~uVar12 & (uint)fVar3 | (uint)fVar13 & uVar12);
  if (((((pIVar4->DC).ColumnsFlags & 1) == 0) && (pIVar4->SkipItems == false)) &&
     (1 < (pIVar4->DC).ColumnsCount)) {
    local_80 = (pIVar4->DC).ColumnsStartPosY;
    local_84 = local_80 + 1.0;
    uVar12 = 1;
    local_90 = 0xffffffff;
    do {
      local_a8._0_4_ = (pIVar4->Pos).x;
      fVar13 = GetColumnOffset(uVar12);
      local_a8._0_4_ = fVar13 + (float)local_a8._0_4_;
      id = (pIVar4->DC).ColumnsSetId + uVar12;
      local_58.Min.x = (float)local_a8._0_4_ + -4.0;
      local_a8._4_4_ = extraout_XMM0_Db;
      local_a8._8_4_ = extraout_XMM0_Dc;
      local_a8._12_4_ = extraout_XMM0_Dd;
      local_58.Max.x = (float)local_a8._0_4_ + 4.0;
      local_58.Min.y = local_80;
      local_58.Max.y = local_48;
      local_7c = id;
      bVar8 = IsClippedEx(&local_58,&local_7c,false);
      if (!bVar8) {
        local_a9 = false;
        local_aa = false;
        if (((pIVar4->DC).ColumnsFlags & 2) == 0) {
          ButtonBehavior(&local_58,id,&local_a9,&local_aa,0);
          if (local_a9 == false) {
            if ((local_aa & 1U) != 0) {
              pIVar10->MouseCursor = 4;
              goto LAB_001639d1;
            }
          }
          else {
            pIVar10->MouseCursor = 4;
            if ((local_aa & 1U) != 0) {
LAB_001639d1:
              if (pIVar10->ActiveIdIsJustActivated == true) {
                (pIVar10->ActiveIdClickOffset).x = (pIVar10->ActiveIdClickOffset).x + -4.0;
              }
              local_90 = (ulong)uVar12;
            }
          }
        }
        uVar9 = local_a9 | 0x1c;
        if ((local_aa & 1U) != 0) {
          uVar9 = 0x1e;
        }
        puVar2 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar9 << 4));
        local_78._0_8_ = *puVar2;
        uVar6 = puVar2[1];
        local_78.w = (float)((ulong)uVar6 >> 0x20);
        local_78.z = (float)uVar6;
        local_78.w = (GImGui->Style).Alpha * local_78.w;
        col = ColorConvertFloat4ToU32(&local_78);
        local_60.x = (float)(int)(float)local_a8._0_4_;
        local_78.y = local_84;
        local_78.x = local_60.x;
        local_60.y = local_48;
        ImDrawList::AddLine(pIVar4->DrawList,(ImVec2 *)&local_78,&local_60,col,1.0);
      }
      pIVar7 = GImGui;
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < (pIVar4->DC).ColumnsCount);
    column_index = (int)local_90;
    if (column_index != -1) {
      if (column_index < 1) {
        __assert_fail("column_index > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                      ,0x2753,"float GetDraggedColumnOffset(int)");
      }
      pIVar5 = GImGui->CurrentWindow;
      if (GImGui->ActiveId != (pIVar5->DC).ColumnsSetId + column_index) {
        __assert_fail("g.ActiveId == window->DC.ColumnsSetId + ImGuiID(column_index)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                      ,0x2754,"float GetDraggedColumnOffset(int)");
      }
      local_a8 = ZEXT416((uint)(((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) -
                               (pIVar5->Pos).x));
      fVar13 = GetColumnOffset(column_index + -1);
      fVar13 = fVar13 + (pIVar7->Style).ColumnsMinSpacing;
      uVar12 = -(uint)(fVar13 <= (float)local_a8._0_4_);
      fVar13 = (float)(~uVar12 & (uint)fVar13 | local_a8._0_4_ & uVar12);
      if (((pIVar5->DC).ColumnsFlags & 4) != 0) {
        local_a8._4_4_ = local_a8._4_4_ & extraout_XMM0_Db_00;
        local_a8._0_4_ = fVar13;
        local_a8._8_4_ = local_a8._8_4_ & extraout_XMM0_Dc_00;
        local_a8._12_4_ = local_a8._12_4_ & extraout_XMM0_Dd_00;
        fVar14 = GetColumnOffset(column_index + 1);
        fVar14 = fVar14 - (pIVar7->Style).ColumnsMinSpacing;
        fVar13 = (float)local_a8._0_4_;
        if (fVar14 <= (float)local_a8._0_4_) {
          fVar13 = fVar14;
        }
      }
      SetColumnOffset(column_index,fVar13);
    }
  }
  (pIVar4->DC).ColumnsCurrent = 0;
  (pIVar4->DC).ColumnsCount = 1;
  (pIVar4->DC).ColumnsFlags = 0;
  pIVar10 = GImGui;
  (pIVar4->DC).ColumnsSetId = 0;
  if (-1 < (pIVar4->DC).ColumnsData.Capacity) goto LAB_00163be8;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (ImGuiColumnData *)(*(pIVar10->IO).MemAllocFn)(0);
  pIVar11 = (pIVar4->DC).ColumnsData.Data;
  if (pIVar11 == (ImGuiColumnData *)0x0) {
LAB_00163bce:
    pIVar11 = (ImGuiColumnData *)0x0;
    pIVar10 = GImGui;
  }
  else {
    memcpy(__dest,pIVar11,(long)(pIVar4->DC).ColumnsData.Size * 0x14);
    pIVar10 = GImGui;
    pIVar11 = (pIVar4->DC).ColumnsData.Data;
    if (pIVar11 == (ImGuiColumnData *)0x0) goto LAB_00163bce;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar10->IO).MemFreeFn)(pIVar11);
  (pIVar4->DC).ColumnsData.Data = __dest;
  (pIVar4->DC).ColumnsData.Capacity = 0;
LAB_00163be8:
  (pIVar4->DC).ColumnsData.Size = 0;
  (pIVar4->DC).ColumnsOffsetX = 0.0;
  (pIVar4->DC).CursorPos.x = (float)(int)((pIVar4->Pos).x + (pIVar4->DC).IndentX + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(window->DC.ColumnsCount > 1);

    PopItemWidth();
    PopClipRect();
    window->DrawList->ChannelsMerge();

    window->DC.ColumnsCellMaxY = ImMax(window->DC.ColumnsCellMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = window->DC.ColumnsCellMaxY;
    window->DC.CursorMaxPos.x = ImMax(window->DC.ColumnsStartMaxPosX, window->DC.ColumnsMaxX);  // Columns don't grow parent

    // Draw columns borders and handle resize
    if (!(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        const float y1 = window->DC.ColumnsStartPosY;
        const float y2 = window->DC.CursorPos.y;
        int dragging_column = -1;
        for (int i = 1; i < window->DC.ColumnsCount; i++)
        {
            float x = window->Pos.x + GetColumnOffset(i);
            const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(i);
            const float column_w = 4.0f; // Width for interaction
            const ImRect column_rect(ImVec2(x - column_w, y1), ImVec2(x + column_w, y2));
            if (IsClippedEx(column_rect, &column_id, false))
                continue;
            
            bool hovered = false, held = false;
            if (!(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && g.ActiveIdIsJustActivated)
                    g.ActiveIdClickOffset.x -= column_w; // Store from center of column line (we used a 8 wide rect for columns clicking). This is used by GetDraggedColumnOffset().
                if (held)
                    dragging_column = i;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            float x = GetDraggedColumnOffset(dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }

    window->DC.ColumnsSetId = 0;
    window->DC.ColumnsCurrent = 0;
    window->DC.ColumnsCount = 1;
    window->DC.ColumnsFlags = 0;
    window->DC.ColumnsData.resize(0);
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);
}